

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeGetColumn(Parse *pParse,Table *pTab,int iColumn,int iTable,int iReg,u8 p5)

{
  VdbeOp *pVVar1;
  undefined8 in_RDI;
  int in_R8D;
  byte in_R9B;
  VdbeOp *pOp;
  undefined3 in_stack_00000008;
  
  sqlite3ExprCodeGetColumnOfTable
            ((Vdbe *)CONCAT44(iColumn,iTable),(Table *)CONCAT44(iReg,_in_stack_00000008),pOp._4_4_,
             (int)pOp,(int)((ulong)in_RDI >> 0x20));
  if (in_R9B != 0) {
    pVVar1 = sqlite3VdbeGetLastOp((Vdbe *)0x1cb9d7);
    if (pVVar1->opcode == '^') {
      pVVar1->p5 = (ushort)in_R9B;
    }
    if (pVVar1->opcode == 0xb0) {
      pVVar1->p5 = in_R9B & 1;
    }
  }
  return in_R8D;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeGetColumn(
  Parse *pParse,   /* Parsing and code generating context */
  Table *pTab,     /* Description of the table we are reading from */
  int iColumn,     /* Index of the table column */
  int iTable,      /* The cursor pointing to the table */
  int iReg,        /* Store results here */
  u8 p5            /* P5 value for OP_Column + FLAGS */
){
  assert( pParse->pVdbe!=0 );
  assert( (p5 & (OPFLAG_NOCHNG|OPFLAG_TYPEOFARG|OPFLAG_LENGTHARG))==p5 );
  assert( IsVirtual(pTab) || (p5 & OPFLAG_NOCHNG)==0 );
  sqlite3ExprCodeGetColumnOfTable(pParse->pVdbe, pTab, iTable, iColumn, iReg);
  if( p5 ){
    VdbeOp *pOp = sqlite3VdbeGetLastOp(pParse->pVdbe);
    if( pOp->opcode==OP_Column ) pOp->p5 = p5;
    if( pOp->opcode==OP_VColumn ) pOp->p5 = (p5 & OPFLAG_NOCHNG);
  }
  return iReg;
}